

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dir.c
# Opt level: O1

int TIFFUnsetField(TIFF *tif,uint32_t tag)

{
  TIFFTagValue *pTVar1;
  undefined8 *puVar2;
  uint32_t *puVar3;
  undefined8 *puVar4;
  ushort uVar5;
  byte bVar6;
  undefined8 uVar7;
  TIFFField *pTVar8;
  TIFFTagValue *pTVar9;
  TIFFTagValue *pTVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  bool bVar16;
  
  pTVar8 = TIFFFieldWithTag(tif,tag);
  if (pTVar8 == (TIFFField *)0x0) {
    iVar12 = 0;
  }
  else {
    uVar5 = pTVar8->field_bit;
    if (uVar5 == 0x41) {
      uVar14 = (tif->tif_dir).td_customValueCount;
      uVar13 = (ulong)uVar14;
      uVar15 = 0;
      bVar16 = 0 < (int)uVar14;
      if ((int)uVar14 < 1) {
        pTVar10 = (TIFFTagValue *)0x0;
      }
      else {
        pTVar9 = (tif->tif_dir).td_customValues;
        pTVar10 = pTVar9;
        if (pTVar9->info->field_tag != tag) {
          pTVar10 = pTVar9 + (uVar14 - 1);
          uVar15 = 0;
          do {
            if (uVar13 - 1 == uVar15) {
              bVar16 = uVar15 + 1 < uVar13;
              uVar15 = (ulong)uVar14;
              goto LAB_0028f467;
            }
            pTVar1 = pTVar9 + 1;
            pTVar9 = pTVar9 + 1;
            uVar15 = uVar15 + 1;
          } while (pTVar1->info->field_tag != tag);
          bVar16 = uVar15 < uVar13;
          pTVar10 = pTVar9;
        }
      }
LAB_0028f467:
      if (bVar16) {
        _TIFFfreeExt(tif,pTVar10->value);
        iVar12 = (tif->tif_dir).td_customValueCount + -1;
        if ((int)uVar15 < iVar12) {
          lVar11 = (uVar15 & 0xffffffff) * 0x18;
          do {
            pTVar10 = (tif->tif_dir).td_customValues;
            *(undefined8 *)((long)&pTVar10->value + lVar11) =
                 *(undefined8 *)((long)&pTVar10[1].value + lVar11);
            puVar4 = (undefined8 *)((long)&pTVar10[1].info + lVar11);
            uVar7 = puVar4[1];
            puVar2 = (undefined8 *)((long)&pTVar10->info + lVar11);
            *puVar2 = *puVar4;
            puVar2[1] = uVar7;
            iVar12 = (tif->tif_dir).td_customValueCount + -1;
            lVar11 = lVar11 + 0x18;
            uVar14 = (int)uVar15 + 1;
            uVar15 = (ulong)uVar14;
          } while ((int)uVar14 < iVar12);
        }
        (tif->tif_dir).td_customValueCount = iVar12;
      }
    }
    else {
      bVar6 = (byte)uVar5 & 0x1f;
      puVar3 = (tif->tif_dir).td_fieldsset + (uVar5 >> 5);
      *puVar3 = *puVar3 & (-2 << bVar6 | 0xfffffffeU >> 0x20 - bVar6);
    }
    *(byte *)&tif->tif_flags = (byte)tif->tif_flags | 8;
    iVar12 = 1;
  }
  return iVar12;
}

Assistant:

int TIFFUnsetField(TIFF *tif, uint32_t tag)
{
    const TIFFField *fip = TIFFFieldWithTag(tif, tag);
    TIFFDirectory *td = &tif->tif_dir;

    if (!fip)
        return 0;

    if (fip->field_bit != FIELD_CUSTOM)
        TIFFClrFieldBit(tif, fip->field_bit);
    else
    {
        TIFFTagValue *tv = NULL;
        int i;

        for (i = 0; i < td->td_customValueCount; i++)
        {

            tv = td->td_customValues + i;
            if (tv->info->field_tag == tag)
                break;
        }

        if (i < td->td_customValueCount)
        {
            _TIFFfreeExt(tif, tv->value);
            for (; i < td->td_customValueCount - 1; i++)
            {
                td->td_customValues[i] = td->td_customValues[i + 1];
            }
            td->td_customValueCount--;
        }
    }

    tif->tif_flags |= TIFF_DIRTYDIRECT;

    return (1);
}